

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void extra_tell_used_size(ctl_extr_rec *ctl,int size)

{
  extr_rec *peVar1;
  extr_rec *rec;
  isoent *isoent;
  int size_local;
  ctl_extr_rec *ctl_local;
  
  if ((ctl->use_extr != 0) &&
     (peVar1 = (ctl->isoent->parent->extr_rec_list).current, peVar1 != (extr_rec *)0x0)) {
    peVar1->offset = size + peVar1->offset;
  }
  ctl->cur_len = size + ctl->cur_len;
  return;
}

Assistant:

static void
extra_tell_used_size(struct ctl_extr_rec *ctl, int size)
{
	struct isoent *isoent;
	struct extr_rec *rec;

	if (ctl->use_extr) {
		isoent = ctl->isoent->parent;
		rec = isoent->extr_rec_list.current;
		if (rec != NULL)
			rec->offset += size;
	}
	ctl->cur_len += size;
}